

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall ConfigTest_write_Test::TestBody(ConfigTest_write_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_278 [8];
  Message local_270 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_268;
  object local_248;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_208;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  object local_1b8;
  allocator<char> local_169;
  string local_168;
  path local_138;
  undefined1 local_110 [8];
  path file_path;
  config l_config;
  ConfigTest_write_Test *this_local;
  
  jessilib::config::config((config *)&file_path._M_cmpts);
  std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
            (&local_138,(char (*) [11])0x691316,auto_format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"",&local_169);
  make_tmp_file((path *)local_110,&local_138,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::filesystem::__cxx11::path::~path(&local_138);
  jessilib::object::object(&local_1b8,(uchar *)"some_data");
  jessilib::config::set_data((object *)&file_path._M_cmpts);
  jessilib::object::~object(&local_1b8);
  std::__cxx11::string::string((string *)&gtest_ar.message_);
  jessilib::config::write
            ((path *)&file_path._M_cmpts,(string *)local_110,(text_encoding)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  jessilib::config::reload();
  jessilib::config::data();
  std::__cxx11::u8string::u8string((u8string *)&local_268);
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&local_208,&local_248,&local_268);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_char8_t[10],_nullptr>
            ((EqHelper *)local_1e8,"l_config.data().get<std::u8string>()","u8\"some_data\"",
             &local_208,(char8_t (*) [10])"some_data");
  std::__cxx11::u8string::~u8string((u8string *)&local_208);
  std::__cxx11::u8string::~u8string((u8string *)&local_268);
  jessilib::object::~object(&local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(local_270);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/config.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=(local_278,local_270);
    testing::internal::AssertHelper::~AssertHelper(local_278);
    testing::Message::~Message(local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  std::filesystem::__cxx11::path::~path((path *)local_110);
  jessilib::config::~config((config *)&file_path._M_cmpts);
  return;
}

Assistant:

TEST(ConfigTest, write) {
	config l_config;
	std::filesystem::path file_path = make_tmp_file("write.test", "");

	l_config.set_data(u8"some_data");
	l_config.write(file_path);

	l_config.reload();
	EXPECT_EQ(l_config.data().get<std::u8string>(), u8"some_data");
}